

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# object.cpp
# Opt level: O0

ssize_t __thiscall r_code::SysObject::read(SysObject *this,int __fd,void *__buf,size_t __nbytes)

{
  SysView *this_00;
  size_t sVar1;
  undefined4 in_register_00000034;
  SysView *v;
  size_t offset;
  Atom local_5c;
  ulong local_58;
  size_t l;
  size_t k;
  size_t j;
  size_t i;
  size_t view_set_size;
  size_t marker_set_size;
  size_t reference_set_size;
  size_t code_size;
  uint32_t *data_local;
  SysObject *this_local;
  
  code_size = CONCAT44(in_register_00000034,__fd);
  this->oid = *(uint32_t *)code_size;
  reference_set_size = (size_t)*(uint *)(code_size + 4);
  marker_set_size = (size_t)*(uint *)(code_size + 8);
  view_set_size = (size_t)*(uint *)(code_size + 0xc);
  i = (size_t)*(uint *)(code_size + 0x10);
  data_local = (uint32_t *)this;
  for (j = 0; j < reference_set_size; j = j + 1) {
    Atom::Atom(&local_5c,*(uint32_t *)(code_size + 0x14 + j * 4));
    vector<r_code::Atom>::push_back(&(this->super_ImageObject).code,&local_5c);
    Atom::~Atom(&local_5c);
  }
  for (k = 0; k < marker_set_size; k = k + 1) {
    vector<unsigned_int>::push_back
              (&(this->super_ImageObject).references,*(uint *)(code_size + (j + 5 + k) * 4));
  }
  for (l = 0; l < view_set_size; l = l + 1) {
    vector<unsigned_int>::push_back(&this->markers,*(uint *)(code_size + (j + 5 + k + l) * 4));
  }
  v = (SysView *)0x0;
  for (local_58 = 0; local_58 < i; local_58 = local_58 + 1) {
    this_00 = (SysView *)operator_new(0x38);
    SysView::SysView(this_00);
    (*(this_00->super_ImageObject)._vptr_ImageObject[3])
              (this_00,code_size + 0x14 + j * 4 + k * 4 + l * 4 + (long)v * 4);
    vector<r_code::SysView_*>::push_back(&this->views,this_00);
    sVar1 = SysView::get_size(this_00);
    v = (SysView *)((long)&(v->super_ImageObject)._vptr_ImageObject + sVar1);
  }
  return local_58;
}

Assistant:

void SysObject::read(uint32_t *data)
{
    oid = data[0];
    size_t code_size = data[1];
    size_t reference_set_size = data[2];
    size_t marker_set_size = data[3];
    size_t view_set_size = data[4];
    size_t i;
    size_t j;
    size_t k;
    size_t l;

    for (i = 0; i < code_size; ++i) {
        code.push_back(Atom(data[5 + i]));
    }

    for (j = 0; j < reference_set_size; ++j) {
        references.push_back(data[5 + i + j]);
    }

    for (k = 0; k < marker_set_size; ++k) {
        markers.push_back(data[5 + i + j + k]);
    }

    size_t offset = 0;

    for (l = 0; l < view_set_size; ++l) {
        SysView *v = new SysView();
        v->read(data + 5 + i + j + k + offset);
        views.push_back(v);
        offset += v->get_size();
    }
}